

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O0

void __thiscall
qclab::qgates::SWAP<std::complex<double>_>::SWAP(SWAP<std::complex<double>_> *this,int *qubits)

{
  int *qubits_local;
  SWAP<std::complex<double>_> *this_local;
  
  QGate2<std::complex<double>_>::QGate2(&this->super_QGate2<std::complex<double>_>);
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0016b200;
  (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject
    [6])(this,qubits);
  return;
}

Assistant:

SWAP( const int* qubits )
        {
          setQubits( qubits ) ;
        }